

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::operator==(TimeArrayTimeZoneRule *this,TimeZoneRule *that)

{
  _func_int **pp_Var1;
  uint uVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  ulong uVar5;
  
  UVar3 = '\x01';
  if (this != (TimeArrayTimeZoneRule *)that) {
    __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
    __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
    if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)))) &&
        (UVar3 = TimeZoneRule::operator==(&this->super_TimeZoneRule,that), UVar3 != '\0')) &&
       (this->fTimeRuleType == *(TimeRuleType *)&that[1].super_UObject._vptr_UObject)) {
      uVar2 = this->fNumStartTimes;
      if (uVar2 == *(uint *)((long)&that[1].super_UObject._vptr_UObject + 4)) {
        if ((int)uVar2 < 1) {
          return '\x01';
        }
        uVar5 = 0;
        while ((pp_Var1 = that[1].fName.super_Replaceable.super_UObject._vptr_UObject + uVar5,
               this->fStartTimes[uVar5] == (double)*pp_Var1 &&
               (!NAN(this->fStartTimes[uVar5]) && !NAN((double)*pp_Var1)))) {
          uVar5 = uVar5 + 1;
          if (uVar2 == uVar5) {
            return '\x01';
          }
        }
      }
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
TimeArrayTimeZoneRule::operator==(const TimeZoneRule& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that) || TimeZoneRule::operator==(that) == FALSE) {
        return FALSE;
    }
    TimeArrayTimeZoneRule *tatzr = (TimeArrayTimeZoneRule*)&that;
    if (fTimeRuleType != tatzr->fTimeRuleType ||
        fNumStartTimes != tatzr->fNumStartTimes) {
        return FALSE;
    }
    // Compare start times
    UBool res = TRUE;
    for (int32_t i = 0; i < fNumStartTimes; i++) {
        if (fStartTimes[i] != tatzr->fStartTimes[i]) {
            res = FALSE;
            break;
        }
    }
    return res;
}